

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
          (ParameterizedTestCaseRegistry *this)

{
  pointer ppPVar1;
  
  for (ppPVar1 = (this->test_case_infos_).
                 super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar1 !=
      (this->test_case_infos_).
      super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
    if (*ppPVar1 != (ParameterizedTestCaseInfoBase *)0x0) {
      (**(code **)(*(long *)*ppPVar1 + 8))();
    }
  }
  std::
  _Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
  ::~_Vector_base((_Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                   *)this);
  return;
}

Assistant:

~ParameterizedTestCaseRegistry() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      delete *it;
    }
  }